

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

string * __thiscall bloaty::macho::MachOObjectFile::GetBuildId_abi_cxx11_(MachOObjectFile *this)

{
  string_view maybe_fat_file;
  InputFile *this_00;
  char *in_RSI;
  string *in_RDI;
  string_view sVar1;
  string *id;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  this_00 = ObjectFile::file_data((ObjectFile *)0x1bf779);
  sVar1 = InputFile::data(this_00);
  maybe_fat_file._M_len._7_1_ = uVar2;
  maybe_fat_file._M_len._0_7_ = in_stack_ffffffffffffffe8;
  maybe_fat_file._M_str = in_RSI;
  ForEachLoadCommand<bloaty::macho::MachOObjectFile::GetBuildId[abi:cxx11]()const::_lambda(bloaty::macho::LoadCommand)_1_>
            (maybe_fat_file,(RangeSink *)sVar1._M_str,(anon_class_8_1_3fcf65d9 *)sVar1._M_len);
  return in_RDI;
}

Assistant:

std::string GetBuildId() const override {
    std::string id;

    ForEachLoadCommand(file_data().data(), nullptr, [&id](LoadCommand cmd) {
      if (cmd.cmd == LC_UUID) {
        auto uuid_cmd =
            GetStructPointerAndAdvance<uuid_command>(&cmd.command_data);
        if (!cmd.command_data.empty()) {
          THROWF("Unexpected excess uuid data: $0", cmd.command_data.size());
        }
        id.resize(sizeof(uuid_cmd->uuid));
        memcpy(&id[0], &uuid_cmd->uuid[0], sizeof(uuid_cmd->uuid));
      }
    });

    return id;
  }